

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeContainer.hpp
# Opt level: O1

bool __thiscall
OpenMD::TypeContainer<OpenMD::BendType,_3>::add
          (TypeContainer<OpenMD::BendType,_3> *this,KeyType *keys,ElemPtr elem)

{
  int iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>,_bool>
  pVar2;
  pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>
  pStack_48;
  
  iVar1 = this->index_;
  this->index_ = iVar1 + 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&pStack_48.first,keys);
  pStack_48.second.first = iVar1;
  pStack_48.second.second = elem;
  pVar2 = std::
          _Rb_tree<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>,std::_Select1st<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>,std::less<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>>
          ::
          _M_insert_unique<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>
                    ((_Rb_tree<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>,std::_Select1st<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>,std::less<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>>
                      *)&this->data_,&pStack_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pStack_48.first);
  return (bool)(pVar2.second & 1);
}

Assistant:

bool add(KeyType& keys, ElemPtr elem) {
      assert(keys.size() == SIZE);
      assert(elem);
      return data_.insert(value_type(keys, std::make_pair(index_++, elem)))
          .second;
    }